

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O3

void __thiscall Privkey_ConvertWif_error_Test::TestBody(Privkey_ConvertWif_error_Test *this)

{
  bool bVar1;
  char *in_R9;
  Privkey privkey;
  string wif;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  string local_50;
  string local_30;
  
  cfd::core::Privkey::Privkey((Privkey *)&local_50);
  cfd::core::Privkey::ConvertWif_abi_cxx11_(&local_30,(Privkey *)&local_50,kMainnet,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
      &local_30.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_));
  }
  if (local_50._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p._0_1_ = 0;
  local_30._M_string_length = 0;
  testing::Message::Message((Message *)&local_60);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_50,(internal *)&local_30,(AssertionResult *)0x4e8874,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
             ,0x78,local_50._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_60.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_60.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Privkey, ConvertWif_error) {
  try {
    Privkey privkey;
    std::string wif = privkey.ConvertWif(NetType::kMainnet, false);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Error Private key to WIF.");
    return;
  }
  ASSERT_TRUE(false);
}